

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O3

void __thiscall
PythonModuleClient::recv_event(PythonModuleClient *this,string *origin,string *event,TrodesMsg *msg)

{
  pointer pcVar1;
  undefined4 uVar2;
  int iVar3;
  override recv_event;
  undefined1 local_78 [8];
  long *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  uVar2 = PyGILState_Ensure();
  boost::python::converter::registration::get_class_object
            (boost::python::converter::detail::registered_base<AbstractModuleClient_const_volatile&>
             ::converters);
  boost::python::detail::wrapper_base::get_override
            (local_78,(_typeobject *)&this->super_wrapper<AbstractModuleClient>);
  iVar3 = PyObject_IsTrue(local_78);
  if (iVar3 < 0) {
    boost::python::throw_error_already_set();
  }
  else if (iVar3 == 0) {
    *(long *)local_78 = *(long *)local_78 + -1;
    if (*(long *)local_78 == 0) {
      _Py_Dealloc();
    }
    pcVar1 = (origin->_M_dataplus)._M_p;
    local_68._M_allocated_capacity = (size_type)local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + origin->_M_string_length);
    pcVar1 = (event->_M_dataplus)._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + event->_M_string_length);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if ((long *)local_68._M_allocated_capacity != local_58) {
      operator_delete((void *)local_68._M_allocated_capacity,local_58[0] + 1);
    }
    goto LAB_00242ec0;
  }
  boost::python::override::operator()
            ((override *)&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,origin,
             (TrodesMsg *)event);
  if ((local_70 != (long *)0x0) && (*local_70 = *local_70 + -1, *local_70 == 0)) {
    _Py_Dealloc();
  }
  *(long *)local_78 = *(long *)local_78 + -1;
  if (*(long *)local_78 == 0) {
    _Py_Dealloc();
  }
LAB_00242ec0:
  PyGILState_Release(uVar2);
  return;
}

Assistant:

void recv_event(std::string origin, std::string event, TrodesMsg &msg){
        PyLockGIL lock;
        if(override recv_event = this->get_override("recv_event")){
            try{
                recv_event(origin, event, msg);
            }
            catch (const error_already_set&){
                std::cout << "Exception in recv_event in application";
                PyErr_Print();
            }
            return;
        }
        AbstractModuleClient::recv_event(origin, event, msg);
    }